

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# po_man.cpp
# Opt level: O0

void __thiscall FPolyObj::FPolyObj(FPolyObj *this)

{
  TVector2<double> local_30 [2];
  FPolyObj *local_10;
  FPolyObj *this_local;
  
  local_10 = this;
  TArray<side_t_*,_side_t_*>::TArray(&this->Sidedefs);
  TArray<line_t_*,_line_t_*>::TArray(&this->Linedefs);
  TArray<vertex_t_*,_vertex_t_*>::TArray(&this->Vertices);
  TArray<FPolyVertex,_FPolyVertex>::TArray(&this->OriginalPts);
  TArray<FPolyVertex,_FPolyVertex>::TArray(&this->PrevPts);
  FPolyVertex::FPolyVertex(&this->StartSpot);
  FPolyVertex::FPolyVertex(&this->CenterSpot);
  FBoundingBox::FBoundingBox(&this->Bounds);
  TAngle<double>::TAngle(&this->Angle);
  TObjPtr<DPolyAction>::TObjPtr(&this->specialdata);
  TObjPtr<DInterpolation>::TObjPtr(&this->interpolation);
  TVector2<double>::TVector2(local_30,0.0,0.0);
  TVector2<double>::operator=(&(this->StartSpot).pos,local_30);
  TAngle<double>::operator=(&this->Angle,0.0);
  this->tag = 0;
  memset(this->bbox,0,0x10);
  this->validcount = 0;
  this->crush = 0;
  this->bHurtOnTouch = false;
  this->seqType = 0;
  this->Size = 0.0;
  this->bBlocked = false;
  this->subsectorlinks = (FPolyNode *)0x0;
  TObjPtr<DPolyAction>::operator=(&this->specialdata,(DPolyAction *)0x0);
  TObjPtr<DInterpolation>::operator=(&this->interpolation,(DInterpolation *)0x0);
  return;
}

Assistant:

FPolyObj::FPolyObj()
{
	StartSpot.pos = { 0,0 };
	Angle = 0.;
	tag = 0;
	memset(bbox, 0, sizeof(bbox));
	validcount = 0;
	crush = 0;
	bHurtOnTouch = false;
	seqType = 0;
	Size = 0;
	bBlocked = false;
	subsectorlinks = NULL;
	specialdata = NULL;
	interpolation = NULL;
}